

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O3

void __thiscall QGraphicsView::wheelEvent(QGraphicsView *this,QWheelEvent *event)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  bool bVar4;
  ulong uVar5;
  QPointF QVar6;
  uint uVar7;
  QWidget *widget;
  uint uVar8;
  uint uVar9;
  QObject *pQVar10;
  long in_FS_OFFSET;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  QPoint local_70;
  QPointF local_68;
  undefined1 local_58 [16];
  QScopedPointer<QGraphicsSceneEventPrivate,_QScopedPointerDeleter<QGraphicsSceneEventPrivate>_>
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  if ((((*(long *)(lVar1 + 0x490) == 0) || (*(int *)(*(long *)(lVar1 + 0x490) + 4) == 0)) ||
      (*(long *)(lVar1 + 0x498) == 0)) || ((*(byte *)(lVar1 + 0x300) & 1) == 0)) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      QAbstractScrollArea::wheelEvent((QAbstractScrollArea *)this,event);
      return;
    }
  }
  else {
    event[0xc] = (QWheelEvent)0x0;
    local_48.d = (QGraphicsSceneEventPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QGraphicsSceneWheelEvent::QGraphicsSceneWheelEvent
              ((QGraphicsSceneWheelEvent *)local_58,GraphicsSceneWheel);
    widget = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    QGraphicsSceneEvent::setWidget((QGraphicsSceneEvent *)local_58,widget);
    auVar13 = QEventPoint::position();
    dVar11 = (double)((ulong)auVar13._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar13._0_8_;
    bVar3 = 2147483647.0 < dVar11;
    if (dVar11 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    local_70.xp.m_i =
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar11);
    dVar11 = (double)((ulong)auVar13._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar13._8_8_;
    bVar3 = 2147483647.0 < dVar11;
    if (dVar11 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    local_70.yp.m_i =
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar11);
    local_68 = mapToScene(this,&local_70);
    QGraphicsSceneWheelEvent::setScenePos((QGraphicsSceneWheelEvent *)local_58,&local_68);
    auVar13 = QEventPoint::globalPosition();
    QVar6 = local_68;
    dVar11 = (double)((ulong)auVar13._0_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar13._0_8_;
    bVar3 = 2147483647.0 < dVar11;
    if (dVar11 <= -2147483648.0) {
      dVar11 = -2147483648.0;
    }
    dVar12 = (double)((ulong)auVar13._8_8_ & 0x8000000000000000 | 0x3fe0000000000000) +
             auVar13._8_8_;
    bVar4 = 2147483647.0 < dVar12;
    if (dVar12 <= -2147483648.0) {
      dVar12 = -2147483648.0;
    }
    local_68.xp._4_4_ =
         (int)(double)(-(ulong)bVar4 & 0x41dfffffffc00000 | ~-(ulong)bVar4 & (ulong)dVar12);
    local_68.xp._0_4_ =
         (int)(double)(-(ulong)bVar3 & 0x41dfffffffc00000 | ~-(ulong)bVar3 & (ulong)dVar11);
    local_68.yp = QVar6.yp;
    pQVar10 = (QObject *)0x0;
    QGraphicsSceneWheelEvent::setScreenPos((QGraphicsSceneWheelEvent *)local_58,(QPoint *)&local_68)
    ;
    QGraphicsSceneWheelEvent::setButtons
              ((QGraphicsSceneWheelEvent *)local_58,
               (QFlagsStorageHelper<Qt::MouseButton,_4>)
               *(QFlagsStorage<Qt::MouseButton> *)(event + 0x44));
    QGraphicsSceneWheelEvent::setModifiers
              ((QGraphicsSceneWheelEvent *)local_58,
               (QFlagsStorageHelper<Qt::KeyboardModifier,_4>)
               *(QFlagsStorage<Qt::KeyboardModifier> *)(event + 0x20));
    uVar2 = *(ulong *)(event + 0x58);
    uVar7 = (uint)uVar2;
    uVar8 = -uVar7;
    if (0 < (int)uVar7) {
      uVar8 = uVar7;
    }
    uVar9 = (uint)(uVar2 >> 0x20);
    uVar7 = -uVar9;
    if (0 < (int)uVar9) {
      uVar7 = uVar9;
    }
    uVar5 = uVar2 >> 0x20;
    if (uVar7 < uVar8) {
      uVar5 = uVar2;
    }
    QGraphicsSceneWheelEvent::setDelta((QGraphicsSceneWheelEvent *)local_58,(int)uVar5);
    QGraphicsSceneWheelEvent::setPixelDelta
              ((QGraphicsSceneWheelEvent *)local_58,*(QPoint *)(event + 0x50));
    QGraphicsSceneWheelEvent::setPhase
              ((QGraphicsSceneWheelEvent *)local_58,
               *(ushort *)(event + 0x4e) >> 0xc & (ScrollMomentum|ScrollEnd));
    QGraphicsSceneWheelEvent::setInverted
              ((QGraphicsSceneWheelEvent *)local_58,
               SUB21((ushort)*(undefined2 *)(event + 0x4e) >> 0xf,0));
    QGraphicsSceneWheelEvent::setOrientation
              ((QGraphicsSceneWheelEvent *)local_58,(uVar8 <= uVar7) + Horizontal);
    local_58[0xc] = 0;
    QGraphicsSceneEvent::setTimestamp((QGraphicsSceneEvent *)local_58,*(quint64 *)(event + 0x18));
    if (*(long *)(lVar1 + 0x490) != 0) {
      if (*(int *)(*(long *)(lVar1 + 0x490) + 4) == 0) {
        pQVar10 = (QObject *)0x0;
      }
      else {
        pQVar10 = *(QObject **)(lVar1 + 0x498);
      }
    }
    QCoreApplication::sendEvent(pQVar10,(QEvent *)local_58);
    (**(code **)(*(long *)event + 0x10))(event,local_58[0xc]);
    if (event[0xc] == (QWheelEvent)0x0) {
      QAbstractScrollArea::wheelEvent((QAbstractScrollArea *)this,event);
    }
    QGraphicsSceneHelpEvent::~QGraphicsSceneHelpEvent((QGraphicsSceneHelpEvent *)local_58);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::wheelEvent(QWheelEvent *event)
{
    Q_D(QGraphicsView);
    if (!d->scene || !d->sceneInteractionAllowed) {
        QAbstractScrollArea::wheelEvent(event);
        return;
    }

    event->ignore();

    QGraphicsSceneWheelEvent wheelEvent(QEvent::GraphicsSceneWheel);
    wheelEvent.setWidget(viewport());
    wheelEvent.setScenePos(mapToScene(event->position().toPoint()));
    wheelEvent.setScreenPos(event->globalPosition().toPoint());
    wheelEvent.setButtons(event->buttons());
    wheelEvent.setModifiers(event->modifiers());
    const bool horizontal = qAbs(event->angleDelta().x()) > qAbs(event->angleDelta().y());
    wheelEvent.setDelta(horizontal ? event->angleDelta().x() : event->angleDelta().y());
    wheelEvent.setPixelDelta(event->pixelDelta());
    wheelEvent.setPhase(event->phase());
    wheelEvent.setInverted(event->isInverted());
    wheelEvent.setOrientation(horizontal ? Qt::Horizontal : Qt::Vertical);
    wheelEvent.setAccepted(false);
    wheelEvent.setTimestamp(event->timestamp());
    QCoreApplication::sendEvent(d->scene, &wheelEvent);
    event->setAccepted(wheelEvent.isAccepted());
    if (!event->isAccepted())
        QAbstractScrollArea::wheelEvent(event);
}